

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O3

bool tinyobj::parseTriple(char **token,int vsize,int vnsize,int vtsize,vertex_index_t *ret)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  int local_34;
  
  if (ret == (vertex_index_t *)0x0) {
    return false;
  }
  pcVar1 = *token;
  iVar2 = atoi(pcVar1);
  iVar3 = -1;
  if ((iVar2 < 1) && (iVar3 = vsize, iVar2 == 0)) {
    return false;
  }
  local_34 = -1;
  sVar6 = strcspn(pcVar1,"/ \t\r");
  pcVar7 = pcVar1 + sVar6;
  *token = pcVar7;
  iVar4 = -1;
  if (pcVar1[sVar6] == '/') {
    pcVar1 = pcVar7 + 1;
    *token = pcVar1;
    if (pcVar7[1] == '/') {
      pcVar7 = pcVar7 + 2;
      *token = pcVar7;
      iVar4 = atoi(pcVar7);
      iVar5 = -1;
      if ((iVar4 < 1) && (iVar5 = vnsize, iVar4 == 0)) {
        return false;
      }
      local_34 = -1;
    }
    else {
      local_34 = atoi(pcVar1);
      iVar4 = -1;
      if ((local_34 < 1) && (iVar4 = vtsize, local_34 == 0)) {
        return false;
      }
      local_34 = local_34 + iVar4;
      sVar6 = strcspn(pcVar1,"/ \t\r");
      *token = pcVar1 + sVar6;
      if (pcVar1[sVar6] != '/') {
        iVar4 = -1;
        goto LAB_00116d59;
      }
      pcVar7 = pcVar1 + sVar6 + 1;
      *token = pcVar7;
      iVar4 = atoi(pcVar7);
      iVar5 = -1;
      if ((iVar4 < 1) && (iVar5 = vnsize, iVar4 == 0)) {
        return false;
      }
    }
    iVar4 = iVar4 + iVar5;
    sVar6 = strcspn(pcVar7,"/ \t\r");
    *token = pcVar7 + sVar6;
  }
LAB_00116d59:
  ret->v_idx = iVar2 + iVar3;
  ret->vt_idx = local_34;
  ret->vn_idx = iVar4;
  return true;
}

Assistant:

static bool parseTriple(const char **token, int vsize, int vnsize, int vtsize,
                        vertex_index_t *ret) {
  if (!ret) {
    return false;
  }

  vertex_index_t vi(-1);

  if (!fixIndex(atoi((*token)), vsize, &(vi.v_idx))) {
    return false;
  }

  (*token) += strcspn((*token), "/ \t\r");
  if ((*token)[0] != '/') {
    (*ret) = vi;
    return true;
  }
  (*token)++;

  // i//k
  if ((*token)[0] == '/') {
    (*token)++;
    if (!fixIndex(atoi((*token)), vnsize, &(vi.vn_idx))) {
      return false;
    }
    (*token) += strcspn((*token), "/ \t\r");
    (*ret) = vi;
    return true;
  }

  // i/j/k or i/j
  if (!fixIndex(atoi((*token)), vtsize, &(vi.vt_idx))) {
    return false;
  }

  (*token) += strcspn((*token), "/ \t\r");
  if ((*token)[0] != '/') {
    (*ret) = vi;
    return true;
  }

  // i/j/k
  (*token)++;  // skip '/'
  if (!fixIndex(atoi((*token)), vnsize, &(vi.vn_idx))) {
    return false;
  }
  (*token) += strcspn((*token), "/ \t\r");

  (*ret) = vi;

  return true;
}